

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

uint64_t __thiscall tcmalloc::Span::InitFreeList(Span *this,uint64_t obj_bytes)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  uint64_t uVar5;
  long *plVar6;
  
  if (this->location == 0) {
    (this->freelist).free_count_ = 0;
    (this->freelist).head_ = (void *)0x0;
    plVar3 = (long *)(this->page_id * 0x2000);
    uVar2 = (this->page_id + this->npages) * 0x2000;
    if (uVar2 < (long)plVar3 + obj_bytes) {
      uVar5 = 0;
    }
    else {
      lVar1 = 0;
      uVar5 = 0;
      plVar6 = (long *)0;
      do {
        plVar4 = plVar3;
        lVar1 = lVar1 + 0x100000000;
        *plVar4 = (long)plVar6;
        (this->freelist).head_ = plVar4;
        uVar5 = uVar5 + 1;
        plVar3 = (long *)((long)plVar4 + obj_bytes);
        plVar6 = plVar4;
      } while (obj_bytes + (long)((long)plVar4 + obj_bytes) <= uVar2);
      (this->freelist).free_count_ = uVar5;
      uVar5 = lVar1 >> 0x20;
    }
    return uVar5;
  }
  __assert_fail("location == IN_USE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/span.hpp"
                ,0x42,"uint64_t tcmalloc::Span::InitFreeList(uint64_t)");
}

Assistant:

uint64_t InitFreeList(uint64_t obj_bytes) {
        assert(location == IN_USE);
        freelist.Clear();
        assert(freelist.Empty());
        uint64_t ptr = reinterpret_cast<uint64_t>(reinterpret_cast<char *>(page_id * spanPageSize));
        uint64_t limit = ptr + (npages * spanPageSize);
        while (ptr + obj_bytes <= limit) {
            freelist.PushFront((void*)ptr);
            ptr += obj_bytes;
        }
        return freelist.FreeObjects();
    }